

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap.h
# Opt level: O3

char * f2cstrv2(char *fstr,char *cstr,int felem_len,int celem_len,int nelem)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  
  if (0 < nelem) {
    iVar4 = 0;
    do {
      iVar5 = felem_len;
      if (felem_len < 1) {
        *cstr = '\0';
        pcVar6 = cstr;
        if (felem_len == 0) goto LAB_0016481d;
      }
      else {
        do {
          pcVar6 = cstr;
          cVar1 = *fstr;
          fstr = fstr + 1;
          cstr = pcVar6 + 1;
          *pcVar6 = cVar1;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        *cstr = '\0';
        if (0 < felem_len) {
          do {
            pcVar2 = pcVar6;
            if (*pcVar2 != ' ') {
              lVar3 = 1;
              goto LAB_0016481a;
            }
            pcVar6 = pcVar2 + -1;
          } while (cstr + -(long)felem_len < pcVar2);
          lVar3 = 0;
LAB_0016481a:
          pcVar6 = pcVar2 + lVar3;
LAB_0016481d:
          *pcVar6 = '\0';
        }
      }
      cstr = cstr + (celem_len - felem_len);
      iVar4 = iVar4 + 1;
    } while (iVar4 != nelem);
  }
  return cstr + -(long)(nelem * celem_len);
}

Assistant:

static char *f2cstrv2(char *fstr, char* cstr, int felem_len, int celem_len,
               int nelem)
{
   int i,j;

   if( nelem )
      for (i=0; i<nelem; i++, cstr+=(celem_len-felem_len)) {
	 for (j=0; j<felem_len; j++) *cstr++ = *fstr++;
	 *cstr='\0';
	 kill_trailingn( cstr-felem_len, ' ', cstr );
      }
   return( cstr-celem_len*nelem );
}